

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.c
# Opt level: O0

section_t * get_section_by_id(int id)

{
  section_t *ps;
  int id_local;
  
  for (ps = root; (ps != (section_t *)0x0 && (ps->id != id)); ps = ps->next) {
  }
  return ps;
}

Assistant:

section_t* get_section_by_id(int id)
{
    section_t* ps = root;
    while (ps)
    {
        if (ps->id == id)
            break;
        ps = ps->next;
    }
    return ps;
}